

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O2

base_learner * cb_algs_setup(options_i *options,vw *all)

{
  _Head_base<0UL,_CB_ALGS::cb_*,_false> _Var1;
  int iVar2;
  option_group_definition *poVar3;
  ostream *poVar4;
  size_t sVar5;
  base_learner *l;
  single_learner *base;
  learner<CB_ALGS::cb,_example> *plVar6;
  code *pcVar7;
  vw_exception *this;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  size_t ws;
  byte bVar11;
  bool eval;
  allocator local_63e;
  allocator local_63d;
  allocator local_63c;
  allocator local_63b;
  allocator local_63a;
  allocator local_639;
  free_ptr<CB_ALGS::cb> data;
  string type_string;
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8;
  string local_5a8 [32];
  string local_588;
  string local_568;
  string local_548;
  option_group_definition new_options;
  string local_4f0;
  undefined1 local_4d0 [112];
  bool local_460;
  stringstream __msg;
  undefined1 local_420 [96];
  bool local_3c0;
  undefined1 local_2a8 [160];
  typed_option<bool> local_208;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  typed_option<unsigned_int> local_c8;
  
  bVar11 = 0;
  scoped_calloc_or_throw<CB_ALGS::cb>();
  std::__cxx11::string::string((string *)&type_string,"dr",(allocator *)&__msg);
  eval = false;
  std::__cxx11::string::string((string *)&local_548,"Contextual Bandit Options",(allocator *)&__msg)
  ;
  VW::config::option_group_definition::option_group_definition(&new_options,&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::string((string *)&local_568,"cb",&local_639);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&__msg,&local_568,
             &((data._M_t.super___uniq_ptr_impl<CB_ALGS::cb,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_CB_ALGS::cb_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_CB_ALGS::cb_*,_false>._M_head_impl)->cbcs).num_actions);
  local_3c0 = true;
  std::__cxx11::string::string(local_608,"Use contextual bandit learning with <k> costs",&local_63a)
  ;
  std::__cxx11::string::_M_assign((string *)(local_420 + 0x20));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_c8,(typed_option<unsigned_int> *)&__msg);
  poVar3 = VW::config::option_group_definition::add<unsigned_int>(&new_options,&local_c8);
  std::__cxx11::string::string((string *)&local_588,"cb_type",&local_63b);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_4d0,&local_588,&type_string);
  local_460 = true;
  std::__cxx11::string::string
            (local_5a8,"contextual bandit method to use in {ips,dm,dr}",&local_63c);
  std::__cxx11::string::_M_assign((string *)(local_4d0 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_168,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_4d0);
  poVar3 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar3,&local_168);
  std::__cxx11::string::string((string *)&local_5c8,"eval",&local_63d);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_2a8,&local_5c8,&eval);
  std::__cxx11::string::string(local_5e8,"Evaluate a policy rather than optimizing.",&local_63e);
  std::__cxx11::string::_M_assign((string *)(local_2a8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_208,(typed_option<bool> *)local_2a8);
  VW::config::option_group_definition::add<bool>(poVar3,&local_208);
  VW::config::typed_option<bool>::~typed_option(&local_208);
  std::__cxx11::string::~string(local_5e8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_168);
  std::__cxx11::string::~string(local_5a8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_4d0);
  std::__cxx11::string::~string((string *)&local_588);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_608);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_568);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&__msg,"cb",(allocator *)local_4d0);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar2 == '\0') {
    plVar6 = (learner<CB_ALGS::cb,_example> *)0x0;
    goto LAB_0022ef03;
  }
  std::__cxx11::string::string((string *)&__msg,"cb_type",(allocator *)local_4d0);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)&__msg,"cb_type",(allocator *)local_4d0);
    (*options->_vptr_options_i[5])(options,&__msg,&type_string);
    std::__cxx11::string::~string((string *)&__msg);
    (**options->_vptr_options_i)(options,&new_options);
  }
  _Var1._M_head_impl =
       data._M_t.super___uniq_ptr_impl<CB_ALGS::cb,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_CB_ALGS::cb_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_CB_ALGS::cb_*,_false>._M_head_impl;
  iVar2 = std::__cxx11::string::compare((char *)&type_string);
  if (iVar2 == 0) {
LAB_0022ed1f:
    sVar5 = 0;
    ws = 2;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&type_string);
    if (iVar2 == 0) {
      if (eval == true) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<((ostream *)local_420,
                        "direct method can not be used for evaluation --- it is biased.");
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_algs.cc"
                   ,0xa5,&local_4f0);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      sVar5 = 1;
      ws = sVar5;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&type_string);
      if (iVar2 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "warning: cb_type must be in {\'ips\',\'dm\',\'dr\'}; resetting to dr."
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_0022ed1f;
      }
      sVar5 = 2;
      ws = 1;
    }
  }
  ((_Var1._M_head_impl)->cbcs).cb_type = sVar5;
  std::__cxx11::string::string((string *)&__msg,"csoaa",(allocator *)local_4d0);
  iVar2 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar2 == '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::ostream::_M_insert<unsigned_long>((ulong)local_420);
    std::__cxx11::string::string((string *)local_4d0,"csoaa",(allocator *)local_608);
    std::__cxx11::stringbuf::str();
    (*options->_vptr_options_i[5])(options,local_4d0,local_2a8);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)local_4d0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&__msg);
  }
  l = setup_base(options,all);
  base = LEARNER::as_singleline<char,char>(l);
  plVar10 = &all->p->lp;
  if (eval == false) {
    ppuVar9 = &CB::cb_label;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
      ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
      plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    all->label_type = cb;
    plVar6 = LEARNER::learner<CB_ALGS::cb,example>::init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<CB_ALGS::cb,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_CB_ALGS::cb_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_CB_ALGS::cb_*,_false>._M_head_impl,base,
                        CB_ALGS::predict_or_learn<true>,CB_ALGS::predict_or_learn<false>,ws,
                        multiclass);
    pcVar7 = CB_ALGS::finish_example;
  }
  else {
    ppuVar9 = &CB_EVAL::cb_eval;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
      ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
      plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    all->label_type = cb_eval;
    plVar6 = LEARNER::learner<CB_ALGS::cb,example>::init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<CB_ALGS::cb,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_CB_ALGS::cb_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_CB_ALGS::cb_*,_false>._M_head_impl,base,
                        CB_ALGS::learn_eval,CB_ALGS::predict_eval,ws,multiclass);
    pcVar7 = CB_ALGS::eval_finish_example;
  }
  data._M_t.super___uniq_ptr_impl<CB_ALGS::cb,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CB_ALGS::cb_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_CB_ALGS::cb_*,_false>._M_head_impl = (cb *)0x0;
  *(undefined8 *)(plVar6 + 0x58) = *(undefined8 *)(plVar6 + 0x18);
  *(code **)(plVar6 + 0x68) = pcVar7;
  ((_Var1._M_head_impl)->cbcs).scorer = all->scorer;
  *(undefined8 *)(plVar6 + 0xb8) = *(undefined8 *)(plVar6 + 0x18);
  *(undefined8 *)(plVar6 + 0xc0) = *(undefined8 *)(plVar6 + 0x20);
  *(code **)(plVar6 + 200) = CB_ALGS::finish;
LAB_0022ef03:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&type_string);
  std::unique_ptr<CB_ALGS::cb,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar6;
}

Assistant:

base_learner* cb_algs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb>();
  std::string type_string = "dr";
  bool eval = false;

  option_group_definition new_options("Contextual Bandit Options");
  new_options
      .add(make_option("cb", data->cbcs.num_actions).keep().help("Use contextual bandit learning with <k> costs"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr}"))
      .add(make_option("eval", eval).help("Evaluate a policy rather than optimizing."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb"))
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  cb_to_cs& c = data->cbcs;

  size_t problem_multiplier = 2;  // default for DR
  if (type_string.compare("dr") == 0)
    c.cb_type = CB_TYPE_DR;
  else if (type_string.compare("dm") == 0)
  {
    if (eval)
      THROW("direct method can not be used for evaluation --- it is biased.");
    c.cb_type = CB_TYPE_DM;
    problem_multiplier = 1;
  }
  else if (type_string.compare("ips") == 0)
  {
    c.cb_type = CB_TYPE_IPS;
    problem_multiplier = 1;
  }
  else
  {
    std::cerr << "warning: cb_type must be in {'ips','dm','dr'}; resetting to dr." << std::endl;
    c.cb_type = CB_TYPE_DR;
  }

  if (!options.was_supplied("csoaa"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("csoaa", ss.str());
  }

  auto base = as_singleline(setup_base(options, all));
  if (eval)
  {
    all.p->lp = CB_EVAL::cb_eval;
    all.label_type = label_type::cb_eval;
  }
  else
  {
    all.p->lp = CB::cb_label;
    all.label_type = label_type::cb;
  }

  learner<cb, example>* l;
  if (eval)
  {
    l = &init_learner(data, base, learn_eval, predict_eval, problem_multiplier, prediction_type::multiclass);
    l->set_finish_example(eval_finish_example);
  }
  else
  {
    l = &init_learner(
        data, base, predict_or_learn<true>, predict_or_learn<false>, problem_multiplier, prediction_type::multiclass);
    l->set_finish_example(finish_example);
  }
  c.scorer = all.scorer;

  l->set_finish(finish);
  return make_base(*l);
}